

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cpp
# Opt level: O0

void __thiscall Interpreter::print(Interpreter *this)

{
  float *pfVar1;
  ostream *poVar2;
  uint local_14;
  int pos;
  Interpreter *this_local;
  
  local_14 = this->stackPos;
  std::operator<<((ostream *)&std::cout,"^^^^^^stack^^^^^^\n");
  for (; 0 < (int)local_14; local_14 = local_14 - 4) {
    pfVar1 = (float *)stackAt(this,local_14);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pfVar1);
    std::operator<<(poVar2,'\n');
  }
  std::operator<<((ostream *)&std::cout,"^^^^^^^^^^^^^^^^^\n");
  return;
}

Assistant:

void Interpreter::print() {
/*    std::cout << "=====vars=====\n";
    std::map<unsigned int, void *>::iterator it = vars.begin();
    while (it != vars.end()) {
        float f;
        memcpy(&f, it->second, 4);
        std::cout << it->first << " -> " << f << '\n';
        it = std::next(it);
    }

    std::cout << "==============\n";*/

    int pos = stackPos;
    std::cout << "^^^^^^stack^^^^^^\n";
    while (pos > 0) {
        std::cout << *(float *) stackAt(pos) << '\n';
        pos -= 4;
    }
    std::cout << "^^^^^^^^^^^^^^^^^\n";
}